

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

size_t Corrade::Utility::
       formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>>
                 (MutableStringView *buffer,char *format,BasicStringView<const_char> *args,
                 BasicStringView<const_char> *args_1)

{
  size_t sVar1;
  undefined1 local_78 [8];
  BufferFormatter formatters [3];
  BasicStringView<const_char> *args_local_1;
  BasicStringView<const_char> *args_local;
  char *format_local;
  MutableStringView *buffer_local;
  
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)local_78,args);
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)&formatters[0]._value,args_1);
  Implementation::BufferFormatter::BufferFormatter((BufferFormatter *)&formatters[1]._value);
  sVar1 = Implementation::formatFormatters(buffer,format,(BufferFormatter *)local_78,2);
  return sVar1;
}

Assistant:

std::size_t formatInto(const Containers::MutableStringView& buffer, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, format, formatters, sizeof...(args));
}